

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O0

void __thiscall tcu::ThreadUtil::Thread::~Thread(Thread *this)

{
  size_type sVar1;
  reference ppOVar2;
  int local_14;
  int operationNdx;
  Thread *this_local;
  
  (this->super_Thread)._vptr_Thread = (_func_int **)&PTR__Thread_032eccb8;
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<tcu::ThreadUtil::Operation_*,_std::allocator<tcu::ThreadUtil::Operation_*>_>
            ::size(&this->m_operations);
    if ((int)sVar1 <= local_14) break;
    ppOVar2 = std::
              vector<tcu::ThreadUtil::Operation_*,_std::allocator<tcu::ThreadUtil::Operation_*>_>::
              operator[](&this->m_operations,(long)local_14);
    if (*ppOVar2 != (value_type)0x0) {
      (*(*ppOVar2)->_vptr_Operation[1])();
    }
    local_14 = local_14 + 1;
  }
  std::vector<tcu::ThreadUtil::Operation_*,_std::allocator<tcu::ThreadUtil::Operation_*>_>::clear
            (&this->m_operations);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->m_dummyData);
  std::vector<tcu::ThreadUtil::Message,_std::allocator<tcu::ThreadUtil::Message>_>::~vector
            (&this->m_messages);
  de::Mutex::~Mutex(&this->m_messageLock);
  de::Random::~Random(&this->m_random);
  std::vector<tcu::ThreadUtil::Operation_*,_std::allocator<tcu::ThreadUtil::Operation_*>_>::~vector
            (&this->m_operations);
  de::Thread::~Thread(&this->super_Thread);
  return;
}

Assistant:

Thread::~Thread (void)
{
	for (int operationNdx = 0; operationNdx < (int)m_operations.size(); operationNdx++)
		delete m_operations[operationNdx];

	m_operations.clear();
}